

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_relay.cpp
# Opt level: O3

bool __thiscall UDPRelay::AddToLoop(UDPRelay *this,EventLoop *event_loop)

{
  char *local_28;
  long local_20;
  char local_18 [16];
  
  if (this->event_loop_ == (EventLoop *)0x0) {
    if (this->is_closed_ != true) {
      this->event_loop_ = event_loop;
      EventLoop::Add(event_loop,this->server_socket_,9,&this->super_ISockNotify);
      return true;
    }
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_28,local_20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [warning] ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"already closed",0xe);
  }
  else {
    Log::GetInstance();
    Log::FormatTime_abi_cxx11_();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_28,local_20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [warning] ",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"already add to loop",0x13);
  }
  if (local_28 != local_18) {
    operator_delete(local_28);
  }
  return false;
}

Assistant:

bool UDPRelay::AddToLoop(EventLoop * event_loop)
{
    if (event_loop_)
    {
        LOGW << "already add to loop";
        return false;
    }
    if (is_closed_)
    {
        LOGW << "already closed";
        return false;
    }
    event_loop_ = event_loop;
    event_loop_->Add(server_socket_, kPollIn | kPollErr, this);
    return true;
}